

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

Var __thiscall Clasp::Solver::pushAuxVar(Solver *this)

{
  Var v;
  long *plVar1;
  left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> local_38;
  Fill<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_> local_18;
  
  v = Assignment::addVar(&this->assign_);
  setPref(this,v,def_value,'\x02');
  local_38.super_type.super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_ =
       (buf_type *)0x0;
  local_38.super_type.super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>._8_4_ = 0;
  local_38.super_type.super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.left_ = 0;
  local_38.super_type.super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.right_ = 0;
  local_18.val_ = &local_38;
  bk_lib::
  pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,Clasp::GenericWatch,0u>,std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,Clasp::GenericWatch,0u>>>
  ::
  insert_impl<unsigned_int,bk_lib::detail::Fill<bk_lib::left_right_sequence<Clasp::ClauseWatch,Clasp::GenericWatch,0u>>>
            ((pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,Clasp::GenericWatch,0u>,std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,Clasp::GenericWatch,0u>>>
              *)&this->watches_,(this->watches_).ebo_.buf + (this->watches_).ebo_.size,2,&local_18);
  if ((int)local_38.super_type.super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>._8_4_ <
      0) {
    operator_delete(local_38.super_type.
                    super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_);
  }
  plVar1 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
  (**(code **)(*plVar1 + 0x30))(plVar1,this,v,1);
  return v;
}

Assistant:

Var Solver::pushAuxVar() {
	assert(!lazyRem_);
	Var aux = assign_.addVar();
	setPref(aux, ValueSet::def_value, value_false);
	watches_.insert(watches_.end(), 2, WatchList());
	heuristic_->updateVar(*this, aux, 1);
	return aux;
}